

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O2

uint __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
CheckDisposedObjectFreeBitVector(SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  undefined4 *puVar5;
  FreeObject *this_00;
  uint uVar6;
  
  this_00 = this->disposedObjectList;
  if (this_00 == (FreeObject *)0x0) {
    return 0;
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar6 = 1;
  do {
    uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAddressBitIndex(this_00);
    bVar2 = SmallHeapBlockT<MediumAllocationBlockAttributes>::IsValidBitIndex
                      ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,(uint)uVar4);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x279,"(this->IsValidBitIndex(bitIndex))",
                         "this->IsValidBitIndex(bitIndex)");
      if (!bVar2) goto LAB_006a0eec;
      *puVar5 = 0;
    }
    BVar3 = BVStatic<2048UL>::Test
                      (&(this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.debugFreeBits,
                       (uint)uVar4);
    if (BVar3 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x27a,"(!this->GetDebugFreeBitVector()->Test(bitIndex))",
                         "!this->GetDebugFreeBitVector()->Test(bitIndex)");
      if (!bVar2) goto LAB_006a0eec;
      *puVar5 = 0;
    }
    BVar3 = BVStatic<2048UL>::Test
                      (&(this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                        super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeBits,(uint)uVar4)
    ;
    if (BVar3 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x27b,"(free->Test(bitIndex))","free->Test(bitIndex)");
      if (!bVar2) {
LAB_006a0eec:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (this_00 == this->disposedObjectListTail) {
      return uVar6;
    }
    this_00 = FreeObject::GetNext(this_00);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

uint
SmallFinalizableHeapBlockT<TBlockAttributes>::CheckDisposedObjectFreeBitVector()
{
    uint verifyFreeCount = 0;
    // all the finalized object are considered freed, but not allocable yet
    FreeObject *freeObject = this->disposedObjectList;
    if (freeObject != nullptr)
    {
        SmallHeapBlockBitVector * free = this->GetFreeBitVector();
        while (true)
        {
            uint bitIndex = this->GetAddressBitIndex(freeObject);
            Assert(this->IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;

            if (freeObject == this->disposedObjectListTail)
            {
                break;
            }
            freeObject = freeObject->GetNext();
        }
    }
    return verifyFreeCount;
}